

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinusExpression.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Kandinsky::MinusExpression::toString_abi_cxx11_(MinusExpression *this,bool evaluate)

{
  element_type *peVar1;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  __lhs = in_RDI;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x129651);
  (*peVar1->_vptr_BaseExpression[5])(local_38,peVar1,(ulong)(local_11 & 1));
  std::operator+((char *)__lhs,in_RDI);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "- " + m_arg->toString(evaluate);
        }